

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

void __thiscall
compressed_sparse_matrix<filtration_entry_t>::append_column
          (compressed_sparse_matrix<filtration_entry_t> *this)

{
  size_type local_10;
  
  local_10 = std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>::size
                       (&this->entries);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->bounds,&local_10);
  return;
}

Assistant:

void append_column() { bounds.push_back(entries.size()); }